

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall HEkk::debugDualSteepestEdgeWeights(HEkk *this,HighsInt alt_debug_level)

{
  vector<double,_std::allocator<double>_> *__x;
  double dVar1;
  HighsInt iRow;
  HighsDebugStatus HVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined4 uVar6;
  double dVar7;
  uint local_11c;
  undefined1 local_118 [8];
  double dStack_110;
  HVector row_ep;
  
  if (alt_debug_level < 0) {
    alt_debug_level = (this->options_->super_HighsOptionsStruct).highs_debug_level;
  }
  if (alt_debug_level < 2) {
    HVar2 = kNotChecked;
  }
  else {
    local_11c = (this->lp_).num_row_;
    if (alt_debug_level == 2) {
      uVar3 = 0;
      uVar4 = 0;
      if (0 < (int)local_11c) {
        uVar4 = (ulong)local_11c;
      }
      dVar7 = 0.0;
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        dVar7 = dVar7 + ABS((this->dual_edge_weight_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3]);
      }
      uVar3 = 1;
      if (1 < (int)((long)(int)local_11c / 10)) {
        uVar3 = (long)(int)local_11c / 10;
      }
      if (99 < (int)local_11c) {
        uVar3 = 10;
      }
      uVar4 = uVar3 & 0xffffffff;
      row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      row_ep.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      row_ep.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      row_ep.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      row_ep.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      row_ep.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      row_ep.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      HVectorBase<double>::setup(&row_ep,local_11c);
      _local_118 = ZEXT816(0);
      while( true ) {
        iVar5 = (int)uVar4;
        uVar4 = (ulong)(iVar5 - 1);
        if (iVar5 == 0) break;
        iRow = HighsRandom::integer(&this->random_,local_11c);
        dVar1 = computeDualSteepestEdgeWeight(this,iRow,&row_ep);
        uVar6 = local_118._12_4_;
        unique0x1000025b = local_118._8_4_;
        local_118 = (undefined1  [8])
                    ((double)local_118 +
                    ABS((this->dual_edge_weight_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iRow] - dVar1));
        unique0x1000025f = uVar6;
      }
      HVectorBase<double>::~HVectorBase(&row_ep);
      dStack_110 = dVar7;
      local_11c = (uint)uVar3;
    }
    else {
      __x = &this->dual_edge_weight_;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&row_ep,__x);
      uVar4 = 0;
      computeDualSteepestEdgeWeights(this,false);
      uVar3 = 0;
      if (0 < (int)local_11c) {
        uVar3 = (ulong)local_11c;
      }
      local_118 = (undefined1  [8])0x0;
      dStack_110 = 0.0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        dVar7 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        local_118 = (undefined1  [8])
                    ((double)local_118 + ABS(*(double *)(row_ep._0_8_ + uVar4 * 8) - dVar7));
        dStack_110 = dStack_110 + ABS(dVar7);
      }
      std::vector<double,_std::allocator<double>_>::operator=
                (__x,(vector<double,_std::allocator<double>_> *)&row_ep);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&row_ep);
    }
    dVar7 = (double)local_118 / dStack_110;
    if (this->debug_max_relative_dual_steepest_edge_weight_error * 10.0 < dVar7) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "Call %2d; Tick %8d: ",(ulong)(uint)this->debug_solve_call_num_,
                  (ulong)(uint)this->debug_initial_build_synthetic_tick_);
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "HEkk::debugDualSteepestEdgeWeights   Iteration %5d: Checked %2d weights: error = %10.4g; norm = %10.4g; relative error = %10.4g\n"
                  ,local_118._0_4_,dStack_110,dVar7,(ulong)(uint)this->iteration_count_,
                  (ulong)local_11c);
      fflush(_stdout);
      this->debug_max_relative_dual_steepest_edge_weight_error = dVar7;
      if (0.001 < dVar7) {
        return kLargeError;
      }
    }
    HVar2 = kOk;
  }
  return HVar2;
}

Assistant:

HighsDebugStatus HEkk::debugDualSteepestEdgeWeights(
    const HighsInt alt_debug_level) {
  const HighsInt use_debug_level = alt_debug_level >= 0
                                       ? alt_debug_level
                                       : this->options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const HighsInt num_row = lp.num_row_;
  double dual_steepest_edge_weight_norm = 0;
  double dual_steepest_edge_weight_error = 0;
  HighsInt num_check_weight;
  if (use_debug_level < kHighsDebugLevelExpensive) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      dual_steepest_edge_weight_norm += std::fabs(dual_edge_weight_[iRow]);
    }
    // Just check a few weights
    num_check_weight =
        std::max((HighsInt)1, std::min((HighsInt)10, num_row / 10));
    HVector row_ep;
    row_ep.setup(num_row);
    for (HighsInt iCheck = 0; iCheck < num_check_weight; iCheck++) {
      HighsInt iRow = random_.integer(num_row);
      const double true_weight = computeDualSteepestEdgeWeight(iRow, row_ep);
      dual_steepest_edge_weight_error +=
          std::fabs(this->dual_edge_weight_[iRow] - true_weight);
    }
  } else {
    // Check all weights
    num_check_weight = num_row;
    std::vector<double> updated_dual_edge_weight = this->dual_edge_weight_;
    computeDualSteepestEdgeWeights();
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      dual_steepest_edge_weight_norm +=
          std::fabs(this->dual_edge_weight_[iRow]);
      const double error = std::fabs(updated_dual_edge_weight[iRow] -
                                     this->dual_edge_weight_[iRow]);
      dual_steepest_edge_weight_error += error;
    }
    this->dual_edge_weight_ = updated_dual_edge_weight;
  }
  // Now assess the relative error
  assert(dual_steepest_edge_weight_norm > 0);
  double relative_dual_steepest_edge_weight_error =
      dual_steepest_edge_weight_error / dual_steepest_edge_weight_norm;
  const double large_relative_dual_steepest_edge_weight_error = 1e-3;
  if (relative_dual_steepest_edge_weight_error >
      10 * debug_max_relative_dual_steepest_edge_weight_error) {
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "Call %2d; Tick %8d: ", (int)debug_solve_call_num_,
                debug_initial_build_synthetic_tick_);
    highsLogDev(
        options_->log_options, HighsLogType::kInfo,
        "HEkk::debugDualSteepestEdgeWeights   Iteration %5d: Checked %2d "
        "weights: "
        "error = %10.4g; norm = %10.4g; relative error = %10.4g\n",
        (int)iteration_count_, (int)num_check_weight,
        dual_steepest_edge_weight_error, dual_steepest_edge_weight_norm,
        relative_dual_steepest_edge_weight_error);
    fflush(stdout);
    debug_max_relative_dual_steepest_edge_weight_error =
        relative_dual_steepest_edge_weight_error;
    if (relative_dual_steepest_edge_weight_error >
        large_relative_dual_steepest_edge_weight_error)
      return HighsDebugStatus::kLargeError;
  }
  return HighsDebugStatus::kOk;
}